

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeTranslator.h
# Opt level: O1

uint8_t * __thiscall
arangodb::velocypack::AttributeTranslator::translate(AttributeTranslator *this,string_view key)

{
  const_iterator cVar1;
  uint8_t *puVar2;
  key_type local_10;
  
  local_10._M_str = key._M_str;
  local_10._M_len = key._M_len;
  cVar1 = std::
          _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_unsigned_char_*>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_unsigned_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_unsigned_char_*>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_unsigned_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)(this + 8),&local_10);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_unsigned_char_*>,_true>
      ._M_cur == (__node_type *)0x0) {
    puVar2 = (uint8_t *)0x0;
  }
  else {
    puVar2 = *(uint8_t **)
              ((long)cVar1.
                     super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_unsigned_char_*>,_true>
                     ._M_cur + 0x18);
  }
  return puVar2;
}

Assistant:

uint8_t const* translate(std::string_view key) const noexcept {
    auto it = _keyToId.find(key);

    if (it == _keyToId.end()) {
      return nullptr;
    }

    return (*it).second;
  }